

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::SingleThreadRenderCase::executeForContexts
          (SingleThreadRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  int *piVar1;
  Functions *gl;
  ostringstream *poVar2;
  pointer pVVar3;
  pointer ppVar4;
  long *plVar5;
  DepthMode DVar6;
  StencilMode SVar7;
  SingleThreadRenderCase *pSVar8;
  TextureFormat TVar9;
  TextureFormat TVar10;
  pointer pDVar11;
  bool bVar12;
  EGLint EVar13;
  EGLint height;
  EGLint depthBits;
  EGLint stencilBits;
  EGLint EVar14;
  deUint32 dVar15;
  Library *egl;
  ulong uVar16;
  long lVar17;
  Program *pPVar18;
  long *plVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  allocator_type *__a;
  Vec4 *color;
  pointer pDVar23;
  pointer pDVar24;
  pointer pSVar25;
  uint uVar26;
  pointer pDVar27;
  long lVar28;
  void *__s;
  ulong uVar29;
  float depth;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  drawOps;
  PixelFormat pixelFmt;
  Surface refFrame;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  programs;
  Surface frame;
  Random rnd;
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  local_288;
  pointer local_268;
  EGLSurface local_260;
  ulong local_258;
  pointer local_250;
  pointer local_248;
  int local_23c;
  PixelFormat local_238;
  SingleThreadRenderCase *local_228;
  TextureFormat local_220;
  Surface local_218;
  ulong local_200;
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  local_1f8;
  TextureFormat local_1e0;
  Surface local_1d8;
  deRandom local_1c0;
  undefined1 local_1b0 [384];
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  EVar13 = eglu::querySurfaceInt(egl,display,surface,0x3057);
  local_260 = surface;
  height = eglu::querySurfaceInt(egl,display,surface,0x3056);
  uVar16 = (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  local_238 = anon_unknown_4::getPixelFormat(egl,display,config->config);
  depthBits = eglu::getConfigAttribInt(egl,display,config->config,0x3025);
  stencilBits = eglu::getConfigAttribInt(egl,display,config->config,0x3026);
  EVar14 = eglu::getConfigAttribInt(egl,display,config->config,0x3031);
  local_220 = (TextureFormat)
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&local_218,EVar13,height);
  tcu::Surface::Surface(&local_1d8,EVar13,height);
  dVar15 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase
                        .super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  uVar22 = (uint)(uVar16 >> 4);
  uVar26 = ((uint)(uVar16 >> 0x14) & 0xffff ^ uVar22 ^ 0x3d) * 9;
  uVar26 = (uVar26 >> 4 ^ uVar26) * 0x27d4eb2d;
  deRandom_init(&local_1c0,uVar26 >> 0xf ^ dVar15 ^ uVar26);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::vector(&local_1f8,
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4,__a);
  TVar9 = local_220;
  local_288.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_RED_SIZE = ",0xf);
  std::ostream::operator<<(poVar2,local_238.redBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_GREEN_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,local_238.greenBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_BLUE_SIZE = ",0x10);
  std::ostream::operator<<(poVar2,local_238.blueBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_ALPHA_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,local_238.alphaBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_DEPTH_SIZE = ",0x11);
  std::ostream::operator<<(poVar2,depthBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_STENCIL_SIZE = ",0x13);
  std::ostream::operator<<(poVar2,stencilBits);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  TVar10 = local_220;
  local_220.order = TVar9.order;
  local_220.type = TVar9.type;
  local_1b0._0_4_ = local_220.order;
  local_1b0._4_4_ = local_220.type;
  poVar2 = (ostringstream *)(local_1b0 + 8);
  local_220 = TVar10;
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"EGL_SAMPLES = ",0xe);
  std::ostream::operator<<(poVar2,EVar14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pDVar23 = local_288.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pDVar11 = local_288.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar21 = (ulong)(int)(uVar22 * 4);
  lVar28 = (long)local_288.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_288.
                 super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  lVar17 = lVar28 >> 3;
  uVar16 = lVar17 * -0x71c71c71c71c71c7;
  uVar29 = uVar21 + lVar17 * 0x71c71c71c71c71c7;
  local_228 = this;
  if (uVar21 < uVar16 || uVar29 == 0) {
    pDVar11 = local_288.
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar21 < uVar16) {
      pDVar24 = local_288.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar21;
      for (pDVar27 = pDVar24; pDVar23 != pDVar27; pDVar27 = pDVar27 + 1) {
        pVVar3 = (pDVar27->colors).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pVVar3 != (pointer)0x0) {
          operator_delete(pVVar3,(long)(pDVar27->colors).
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pVVar3);
        }
        pVVar3 = (pDVar27->positions).
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pVVar3 != (pointer)0x0) {
          operator_delete(pVVar3,(long)(pDVar27->positions).
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pVVar3);
        }
        pDVar11 = pDVar24;
      }
    }
  }
  else if ((ulong)(((long)local_288.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.
                          super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                          ._M_impl.super__Vector_impl_data._M_finish >> 3) * -0x71c71c71c71c71c7) <
           uVar29) {
    local_250 = local_288.
                super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (lVar17 * 0x71c71c71c71c71c7 + 0x1c71c71c71c71c7U < uVar29) {
      std::__throw_length_error("vector::_M_default_append");
    }
    uVar21 = uVar29;
    if (uVar29 <= uVar16 && uVar16 - uVar29 != 0) {
      uVar21 = uVar16;
    }
    local_248 = (pointer)(uVar21 + uVar16);
    if ((_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
         *)0x1c71c71c71c71c6 < local_248) {
      local_248 = (pointer)0x1c71c71c71c71c7;
    }
    if (CARRY8(uVar21,uVar16)) {
      local_248 = (pointer)0x1c71c71c71c71c7;
    }
    local_268 = std::
                _Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                ::_M_allocate((_Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                               *)local_248,
                              (size_t)local_288.
                                      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __s = (void *)(lVar28 + (long)local_268);
    memset(__s,0,uVar29 * 0x48);
    pDVar24 = local_268;
    for (pDVar27 = pDVar11; pDVar27 != pDVar23; pDVar27 = pDVar27 + 1) {
      iVar20 = pDVar27->count;
      pDVar24->type = pDVar27->type;
      pDVar24->count = iVar20;
      (pDVar24->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pDVar27->positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pDVar24->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pDVar27->positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pDVar24->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pDVar27->positions).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pDVar27->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar27->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar27->positions).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pDVar24->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pDVar27->colors).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
      (pDVar24->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pDVar27->colors).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (pDVar24->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pDVar27->colors).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pDVar27->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pDVar27->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pDVar27->colors).
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      DVar6 = pDVar27->depth;
      SVar7 = pDVar27->stencil;
      iVar20 = pDVar27->stencilRef;
      pDVar24->blend = pDVar27->blend;
      pDVar24->depth = DVar6;
      pDVar24->stencil = SVar7;
      pDVar24->stencilRef = iVar20;
      pVVar3 = (pDVar27->positions).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pVVar3 != (pointer)0x0) {
        operator_delete(pVVar3,(long)(pDVar27->positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pVVar3);
      }
      pDVar24 = pDVar24 + 1;
    }
    if (pDVar11 != (pointer)0x0) {
      operator_delete(pDVar11,(long)local_250 - (long)pDVar11);
    }
    local_288.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_start = local_268;
    local_288.
    super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_268 + (long)local_248;
    this = local_228;
    pDVar11 = (pointer)((long)__s + uVar29 * 0x48);
  }
  else {
    memset(local_288.
           super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
           ._M_impl.super__Vector_impl_data._M_finish,0,uVar29 * 0x48);
    pDVar11 = pDVar23 + uVar29;
  }
  local_288.
  super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ._M_impl.super__Vector_impl_data._M_finish = pDVar11;
  pDVar11 = local_288.
            super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_288.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_288.
      super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pDVar23 = local_288.
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      anon_unknown_4::randomizeDrawOp((Random *)&local_1c0,pDVar23);
      pDVar23 = pDVar23 + 1;
    } while (pDVar23 != pDVar11);
  }
  if (0 < (int)uVar22) {
    uVar16 = (ulong)(uVar22 & 0x7fffffff);
    lVar17 = 0;
    do {
      ppVar4 = (contexts->
               super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      EVar13 = *(EGLint *)((long)&ppVar4->first + lVar17);
      (*egl->_vptr_Library[0x27])
                (egl,display,local_260,local_260,*(undefined8 *)((long)&ppVar4->second + lVar17));
      dVar15 = (*egl->_vptr_Library[0x1f])();
      eglu::checkError(dVar15,"makeCurrent(display, surface, surface, context)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                       ,0x2e2);
      pPVar18 = anon_unknown_4::createProgram(&this->m_gl,EVar13);
      plVar19 = (long *)operator_new(0x20);
      pSVar25 = local_1f8.
                super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar19 + 1) = 0;
      *(undefined4 *)((long)plVar19 + 0xc) = 0;
      *plVar19 = (long)&PTR__SharedPtrState_003f2920;
      plVar19[2] = (long)pPVar18;
      *(undefined4 *)(plVar19 + 1) = 1;
      *(undefined4 *)((long)plVar19 + 0xc) = 1;
      plVar5 = *(long **)((long)&(local_1f8.
                                  super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_state + lVar17);
      if (plVar5 != plVar19) {
        if (plVar5 != (long *)0x0) {
          LOCK();
          plVar5 = plVar5 + 1;
          *(int *)plVar5 = (int)*plVar5 + -1;
          UNLOCK();
          if ((int)*plVar5 == 0) {
            *(undefined8 *)
             ((long)&(local_1f8.
                      super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17) = 0;
            (**(code **)(**(long **)((long)&(local_1f8.
                                             super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_state +
                                    lVar17) + 0x10))();
          }
          LOCK();
          piVar1 = (int *)(*(long *)((long)&pSVar25->m_state + lVar17) + 0xc);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            plVar5 = *(long **)((long)&pSVar25->m_state + lVar17);
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 8))();
            }
            *(undefined8 *)((long)&pSVar25->m_state + lVar17) = 0;
          }
        }
        *(Program **)((long)&pSVar25->m_ptr + lVar17) = pPVar18;
        *(long **)((long)&pSVar25->m_state + lVar17) = plVar19;
        LOCK();
        *(int *)(plVar19 + 1) = (int)plVar19[1] + 1;
        UNLOCK();
        LOCK();
        piVar1 = (int *)(*(long *)((long)&pSVar25->m_state + lVar17) + 0xc);
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      LOCK();
      plVar5 = plVar19 + 1;
      *(int *)plVar5 = (int)*plVar5 + -1;
      UNLOCK();
      if ((int)*plVar5 == 0) {
        (**(code **)(*plVar19 + 0x10))(plVar19);
      }
      LOCK();
      piVar1 = (int *)((long)plVar19 + 0xc);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(code **)(*plVar19 + 8))(plVar19);
      }
      (**(code **)(**(long **)((long)&(local_1f8.
                                       super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar17) +
                  0x10))();
      lVar17 = lVar17 + 0x10;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  ppVar4 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar13 = ppVar4->first;
  (*egl->_vptr_Library[0x27])(egl,display,local_260,local_260,ppVar4->second);
  dVar15 = (*egl->_vptr_Library[0x1f])();
  iVar20 = 0x2ed;
  eglu::checkError(dVar15,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x2ed);
  gl = &this->m_gl;
  anon_unknown_4::clear(gl,EVar13,color,depth,iVar20);
  anon_unknown_4::finish(gl,EVar13);
  local_268 = local_288.
              super__Vector_base<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_248 = local_1f8.
              super__Vector_base<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_250 = (pointer)(ulong)(uVar22 & 0x7fffffff);
  local_23c = uVar22 * 2;
  local_258 = 0;
  uVar26 = 0;
  do {
    local_200 = (ulong)uVar26;
    if (0 < (int)uVar22) {
      uVar21 = 0;
      uVar16 = local_258;
      do {
        ppVar4 = (contexts->
                 super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        EVar13 = ppVar4[uVar21].first;
        (*egl->_vptr_Library[0x27])(egl,display,local_260,local_260,ppVar4[uVar21].second);
        dVar15 = (*egl->_vptr_Library[0x1f])(egl);
        eglu::checkError(dVar15,"makeCurrent(display, surface, surface, context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                         ,0x2fb);
        pDVar11 = local_268;
        pSVar25 = local_248 + uVar21;
        lVar17 = 0;
        do {
          anon_unknown_4::draw
                    (gl,EVar13,pSVar25->m_ptr,
                     (DrawPrimitiveOp *)((long)&pDVar11[(int)uVar16].type + lVar17));
          lVar17 = lVar17 + 0x48;
        } while (lVar17 == 0x48);
        anon_unknown_4::finish(gl,EVar13);
        uVar21 = uVar21 + 1;
        uVar16 = (ulong)((int)uVar16 + 2);
      } while ((pointer)uVar21 != local_250);
    }
    uVar26 = (int)local_200 + 1;
    local_258 = (ulong)(uint)((int)local_258 + local_23c);
  } while ((int)local_200 == 0);
  ppVar4 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar13 = ppVar4->first;
  (*egl->_vptr_Library[0x27])(egl,display,local_260,local_260,ppVar4->second);
  dVar15 = (*egl->_vptr_Library[0x1f])();
  eglu::checkError(dVar15,"makeCurrent(display, surface, surface, context)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x30c);
  anon_unknown_4::readPixels(gl,EVar13,&local_1d8);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  pSVar8 = local_228;
  dVar15 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar15,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderTests.cpp"
                   ,0x311);
  local_1e0.order = RGBA;
  local_1e0.type = UNORM_INT8;
  if ((void *)local_218.m_pixels.m_cap != (void *)0x0) {
    local_218.m_pixels.m_cap = (size_t)local_218.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,&local_1e0,local_218.m_width,local_218.m_height,1,
             (void *)local_218.m_pixels.m_cap);
  TVar9 = local_220;
  anon_unknown_4::renderReference
            ((PixelBufferAccess *)local_1b0,&local_288,&local_238,depthBits,stencilBits,
             (int)local_218.m_pixels.m_cap);
  bVar12 = tcu::fuzzyCompare((TestLog *)TVar9,"ComparisonResult","Image comparison result",
                             &local_218,&local_1d8,0.02,COMPARE_LOG_RESULT);
  if (!bVar12) {
    tcu::TestContext::setTestResult
              ((pSVar8->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  std::
  vector<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp,_std::allocator<deqp::egl::(anonymous_namespace)::DrawPrimitiveOp>_>
  ::~vector(&local_288);
  std::
  vector<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>,_std::allocator<de::SharedPtr<deqp::egl::(anonymous_namespace)::Program>_>_>
  ::~vector(&local_1f8);
  tcu::Surface::~Surface(&local_1d8);
  tcu::Surface::~Surface(&local_218);
  return;
}

Assistant:

void SingleThreadRenderCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&			egl			= m_eglTestCtx.getLibrary();
	const int				width		= eglu::querySurfaceInt(egl, display, surface, EGL_WIDTH);
	const int				height		= eglu::querySurfaceInt(egl, display, surface, EGL_HEIGHT);
	const int				numContexts	= (int)contexts.size();
	const int				drawsPerCtx	= 2;
	const int				numIters	= 2;
	const float				threshold	= 0.02f;

	const tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);
	const int				depthBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_DEPTH_SIZE);
	const int				stencilBits	= eglu::getConfigAttribInt(egl, display, config.config, EGL_STENCIL_SIZE);
	const int				numSamples	= eglu::getConfigAttribInt(egl, display, config.config, EGL_SAMPLES);

	TestLog&				log			= m_testCtx.getLog();

	tcu::Surface			refFrame	(width, height);
	tcu::Surface			frame		(width, height);

	de::Random				rnd			(deStringHash(getName()) ^ deInt32Hash(numContexts));
	vector<ProgramSp>		programs	(contexts.size());
	vector<DrawPrimitiveOp>	drawOps;

	// Log basic information about config.
	log << TestLog::Message << "EGL_RED_SIZE = "		<< pixelFmt.redBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_GREEN_SIZE = "		<< pixelFmt.greenBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_BLUE_SIZE = "		<< pixelFmt.blueBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_ALPHA_SIZE = "		<< pixelFmt.alphaBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_DEPTH_SIZE = "		<< depthBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_STENCIL_SIZE = "	<< stencilBits << TestLog::EndMessage;
	log << TestLog::Message << "EGL_SAMPLES = "			<< numSamples << TestLog::EndMessage;

	// Generate draw ops.
	drawOps.resize(numContexts*drawsPerCtx*numIters);
	for (vector<DrawPrimitiveOp>::iterator drawOp = drawOps.begin(); drawOp != drawOps.end(); ++drawOp)
		randomizeDrawOp(rnd, *drawOp);

	// Create and setup programs per context
	for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
	{
		EGLint		api			= contexts[ctxNdx].first;
		EGLContext	context		= contexts[ctxNdx].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		programs[ctxNdx] = ProgramSp(createProgram(m_gl, api));
		programs[ctxNdx]->setup();
	}

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		clear(m_gl, api, CLEAR_COLOR, CLEAR_DEPTH, CLEAR_STENCIL);
		finish(m_gl, api);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (int ctxNdx = 0; ctxNdx < numContexts; ctxNdx++)
		{
			EGLint		api			= contexts[ctxNdx].first;
			EGLContext	context		= contexts[ctxNdx].second;

			EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

			for (int drawNdx = 0; drawNdx < drawsPerCtx; drawNdx++)
			{
				const DrawPrimitiveOp& drawOp = drawOps[iterNdx*numContexts*drawsPerCtx + ctxNdx*drawsPerCtx + drawNdx];
				draw(m_gl, api, *programs[ctxNdx], drawOp);
			}

			finish(m_gl, api);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, context));

		readPixels(m_gl, api, frame);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));

	// Render reference.
	// \note Reference image is always generated using single-sampling.
	renderReference(refFrame.getAccess(), drawOps, pixelFmt, depthBits, stencilBits, 1);

	// Compare images
	{
		bool imagesOk = tcu::fuzzyCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, threshold, tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}